

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

bool __thiscall Omega_h::StateRowLess::operator()(StateRowLess *this,int *a,int *b)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  ConstRef pvVar4;
  value_type eb;
  value_type ea;
  int ncols;
  int symbol;
  value_type ab;
  value_type aa;
  int *b_local;
  int *a_local;
  StateRowLess *this_local;
  
  pvVar3 = at<int>(this->accepted,*a);
  iVar2 = *pvVar3;
  pvVar3 = at<int>(this->accepted,*b);
  if (iVar2 == *pvVar3) {
    ea = 0;
    iVar2 = get_ncols<int>(this->table);
    for (; ea < iVar2; ea = ea + 1) {
      pvVar4 = at<int>(this->table,*a,ea);
      iVar1 = *pvVar4;
      pvVar4 = at<int>(this->table,*b,ea);
      if (iVar1 != *pvVar4) {
        return iVar1 < *pvVar4;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = iVar2 < *pvVar3;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(int const& a, int const& b) const {
    auto aa = at(accepted, a);
    auto ab = at(accepted, b);
    if (aa != ab) return aa < ab;
    for (int symbol = 0, ncols = get_ncols(table); symbol < ncols; ++symbol) {
      auto ea = at(table, a, symbol);
      auto eb = at(table, b, symbol);
      if (ea != eb) return ea < eb;
    }
    return false;
  }